

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

void __thiscall
CoinSelection_SelectCoins_Simple_Error_KnapsackSolver_insufficient_funds_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_KnapsackSolver_insufficient_funds_Test *this)

{
  bool bVar1;
  Amount AVar2;
  bool use_bnb;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  Amount local_d8;
  Amount local_c8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_b8;
  long *local_a0 [7];
  undefined **local_68;
  pointer local_60;
  Amount fee;
  Amount select_value;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(9500000000);
  local_c8.amount_ = AVar2.amount_;
  local_c8.ignore_check_ = AVar2.ignore_check_;
  cfd::core::Amount::Amount(&select_value);
  cfd::core::Amount::Amount(&fee);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_d8.amount_ = AVar2.amount_;
  local_d8.ignore_check_ = AVar2.ignore_check_;
  use_bnb = false;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    GetBitcoinUtxoList();
    GetBitcoinOption();
    cfd::CoinSelection::SelectCoins
              (&ret,&exp_selection,&local_c8,&local_b8,&exp_filter,(CoinSelectionOption *)local_a0,
               &local_d8,&select_value,&fee,&use_bnb);
    local_68 = &PTR__ConfidentialAssetId_00723760;
    if (local_60 != (pointer)0x0) {
      operator_delete(local_60);
    }
    if (local_b8.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ret.super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)local_a0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&ret,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
             ,0x231,
             "Expected: std::vector<Utxo> ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(), tx_fee, &select_value, &fee, &use_bnb) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&ret,(Message *)local_a0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ret);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0[0] !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*local_a0[0] + 8))();
    }
  }
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_KnapsackSolver_insufficient_funds)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(9500000000);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;
  EXPECT_THROW(std::vector<Utxo> ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, GetBitcoinOption(),
      tx_fee, &select_value, &fee, &use_bnb), CfdException);
}